

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O0

ostream * subsat::operator<<(ostream *os,Constraint *c)

{
  bool bVar1;
  ostream *os_00;
  ostream *poVar2;
  undefined8 in_RSI;
  ostream *in_RDI;
  Lit lit;
  const_iterator __end1;
  const_iterator __begin1;
  Constraint *__range1;
  bool first;
  
  std::operator<<(in_RDI,"{ ");
  bVar1 = true;
  os_00 = (ostream *)Constraint::begin((Constraint *)0xabfa08);
  poVar2 = (ostream *)Constraint::end((Constraint *)0xabfa17);
  for (; os_00 != poVar2; os_00 = os_00 + 4) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      std::operator<<(in_RDI,", ");
    }
    operator<<(os_00,(Lit)(index_type)((ulong)in_RSI >> 0x20));
  }
  std::operator<<(in_RDI," }");
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Constraint const& c)
{
  os << "{ ";
  bool first = true;
  for (Lit lit : c) {
    if (first) {
      first = false;
    } else {
      os << ", ";
    }
    os << lit;
  }
  os << " }";
  return os;
}